

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int z_deflateInit2_(z_streamp strm,int level,int method,int windowBits,int memLevel,int strategy,
                   char *version,int stream_size)

{
  uint uVar1;
  z_uInt zVar2;
  int iVar3;
  code *pcVar4;
  internal_state *piVar5;
  z_Bytef *pzVar6;
  Posf *pPVar7;
  byte bVar8;
  z_uInt zVar9;
  int iVar10;
  z_uInt zVar11;
  uint uVar12;
  
  iVar3 = -6;
  if (((version != (char *)0x0) && (stream_size == 0x58)) && (*version == '1')) {
    iVar3 = -2;
    if (strm != (z_streamp)0x0) {
      strm->msg = (char *)0x0;
      pcVar4 = strm->zalloc;
      if (pcVar4 == (z_alloc_func)0x0) {
        pcVar4 = zcalloc;
        strm->zalloc = zcalloc;
        strm->opaque = (z_voidpf)0x0;
      }
      if (strm->zfree == (z_free_func)0x0) {
        strm->zfree = zcfree;
      }
      uVar12 = 6;
      if (level != -1) {
        uVar12 = level;
      }
      if (windowBits < 0) {
        zVar2 = -windowBits;
        iVar10 = 0;
      }
      else {
        zVar2 = windowBits - 0x10;
        if ((uint)windowBits < 0x10) {
          zVar2 = windowBits;
        }
        iVar10 = 2 - (uint)((uint)windowBits < 0x10);
      }
      if ((((uint)strategy < 5) && (uVar12 < 10)) &&
         ((method == 8 && ((0xfffffff6 < memLevel - 10U && (0xfffffff7 < zVar2 - 0x10)))))) {
        piVar5 = (internal_state *)(*pcVar4)(strm->opaque,1,0x1718);
        iVar3 = -4;
        if (piVar5 != (internal_state *)0x0) {
          zVar9 = 9;
          if (zVar2 != 8) {
            zVar9 = zVar2;
          }
          strm->state = piVar5;
          piVar5->strm = strm;
          piVar5->wrap = iVar10;
          piVar5->gzhead = (gz_headerp)0x0;
          zVar11 = 1 << ((byte)zVar9 & 0x1f);
          piVar5->w_bits = zVar9;
          piVar5->w_size = zVar11;
          piVar5->w_mask = zVar11 - 1;
          piVar5->hash_bits = memLevel + 7;
          bVar8 = (byte)memLevel;
          zVar2 = 0x80 << (bVar8 & 0x1f);
          piVar5->hash_size = zVar2;
          piVar5->hash_mask = zVar2 - 1;
          piVar5->hash_shift = (uint)((byte)(bVar8 + 9) / 3);
          pzVar6 = (z_Bytef *)(*strm->zalloc)(strm->opaque,zVar11,2);
          piVar5->window = pzVar6;
          pPVar7 = (Posf *)(*strm->zalloc)(strm->opaque,piVar5->w_size,2);
          piVar5->prev = pPVar7;
          pPVar7 = (Posf *)(*strm->zalloc)(strm->opaque,piVar5->hash_size,2);
          zVar2 = 0x40 << (bVar8 & 0x1f);
          piVar5->head = pPVar7;
          piVar5->lit_bufsize = zVar2;
          pzVar6 = (z_Bytef *)(*strm->zalloc)(strm->opaque,zVar2,4);
          piVar5->pending_buf = pzVar6;
          uVar1 = piVar5->lit_bufsize;
          piVar5->pending_buf_size = uVar1 * 4;
          if (((piVar5->window != (z_Bytef *)0x0) && (piVar5->prev != (Posf *)0x0)) &&
             (pzVar6 != (z_Bytef *)0x0 && piVar5->head != (Posf *)0x0)) {
            piVar5->d_buf = (ushf *)(pzVar6 + (uVar1 & 0xfffffffe));
            piVar5->l_buf = pzVar6 + (ulong)uVar1 * 3;
            piVar5->level = uVar12;
            piVar5->strategy = strategy;
            piVar5->method = '\b';
            iVar3 = z_deflateReset(strm);
            return iVar3;
          }
          piVar5->status = 0x29a;
          strm->msg = "insufficient memory";
          z_deflateEnd(strm);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int ZEXPORT deflateInit2_(strm, level, method, windowBits, memLevel, strategy,
                  version, stream_size)
    z_streamp strm;
    int  level;
    int  method;
    int  windowBits;
    int  memLevel;
    int  strategy;
    const char *version;
    int stream_size;
{
    deflate_state *s;
    int wrap = 1;
    static const char my_version[] = ZLIB_VERSION;

    ushf *overlay;
    /* We overlay pending_buf and d_buf+l_buf. This works since the average
     * output size for (length,distance) codes is <= 24 bits.
     */

    if (version == Z_NULL || version[0] != my_version[0] ||
        stream_size != sizeof(z_stream)) {
        return Z_VERSION_ERROR;
    }
    if (strm == Z_NULL) return Z_STREAM_ERROR;

    strm->msg = Z_NULL;
    if (strm->zalloc == (alloc_func)0) {
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
    }
    if (strm->zfree == (free_func)0) strm->zfree = zcfree;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif

    if (windowBits < 0) { /* suppress zlib wrapper */
        wrap = 0;
        windowBits = -windowBits;
    }
#ifdef GZIP
    else if (windowBits > 15) {
        wrap = 2;       /* write gzip wrapper instead */
        windowBits -= 16;
    }
#endif
    if (memLevel < 1 || memLevel > MAX_MEM_LEVEL || method != Z_DEFLATED ||
        windowBits < 8 || windowBits > 15 || level < 0 || level > 9 ||
        strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    if (windowBits == 8) windowBits = 9;  /* until 256-byte window bug fixed */
    s = (deflate_state *) ZALLOC(strm, 1, sizeof(deflate_state));
    if (s == Z_NULL) return Z_MEM_ERROR;
    strm->state = (struct internal_state FAR *)s;
    s->strm = strm;

    s->wrap = wrap;
    s->gzhead = Z_NULL;
    s->w_bits = windowBits;
    s->w_size = 1 << s->w_bits;
    s->w_mask = s->w_size - 1;

    s->hash_bits = memLevel + 7;
    s->hash_size = 1 << s->hash_bits;
    s->hash_mask = s->hash_size - 1;
    s->hash_shift =  ((s->hash_bits+MIN_MATCH-1)/MIN_MATCH);

    s->window = (Bytef *) ZALLOC(strm, s->w_size, 2*sizeof(Byte));
    s->prev   = (Posf *)  ZALLOC(strm, s->w_size, sizeof(Pos));
    s->head   = (Posf *)  ZALLOC(strm, s->hash_size, sizeof(Pos));

    s->lit_bufsize = 1 << (memLevel + 6); /* 16K elements by default */

    overlay = (ushf *) ZALLOC(strm, s->lit_bufsize, sizeof(ush)+2);
    s->pending_buf = (uchf *) overlay;
    s->pending_buf_size = (ulg)s->lit_bufsize * (sizeof(ush)+2L);

    if (s->window == Z_NULL || s->prev == Z_NULL || s->head == Z_NULL ||
        s->pending_buf == Z_NULL) {
        s->status = FINISH_STATE;
        strm->msg = (char*)ERR_MSG(Z_MEM_ERROR);
        deflateEnd (strm);
        return Z_MEM_ERROR;
    }
    s->d_buf = overlay + s->lit_bufsize/sizeof(ush);
    s->l_buf = s->pending_buf + (1+sizeof(ush))*s->lit_bufsize;

    s->level = level;
    s->strategy = strategy;
    s->method = (Byte)method;

    return deflateReset(strm);
}